

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O1

void __thiscall
Lib::
SkipList<Indexing::LiteralClause,_Indexing::SubstitutionTree<Indexing::LiteralClause>::LDComparator>
::~SkipList(SkipList<Indexing::LiteralClause,_Indexing::SubstitutionTree<Indexing::LiteralClause>::LDComparator>
            *this)

{
  Node *pNVar1;
  
  pNVar1 = this->_left;
  while (pNVar1->nodes[0] != (Node *)0x0) {
    pop(this);
    pNVar1 = this->_left;
  }
  if (this->_left != (Node *)0x0) {
    operator_delete(this->_left,0x10);
    return;
  }
  return;
}

Assistant:

~SkipList()
  {
    makeEmpty();
    deallocate(_left,SKIP_LIST_MAX_HEIGHT);
  }